

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

bool __thiscall google::protobuf::io::CodedOutputStream::Refresh(CodedOutputStream *this)

{
  int iVar1;
  void *void_buffer;
  uint8 *local_10;
  
  iVar1 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                    (this->output_,&local_10,&this->buffer_size_);
  if (SUB41(iVar1,0) == false) {
    this->buffer_size_ = 0;
    this->had_error_ = true;
    local_10 = (uint8 *)0x0;
  }
  else {
    this->total_bytes_ = this->total_bytes_ + this->buffer_size_;
  }
  this->buffer_ = local_10;
  return SUB41(iVar1,0);
}

Assistant:

bool CodedOutputStream::Refresh() {
  void* void_buffer;
  if (output_->Next(&void_buffer, &buffer_size_)) {
    buffer_ = reinterpret_cast<uint8*>(void_buffer);
    total_bytes_ += buffer_size_;
    return true;
  } else {
    buffer_ = NULL;
    buffer_size_ = 0;
    had_error_ = true;
    return false;
  }
}